

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

void __thiscall cmInstallGenerator::GenerateScript(cmInstallGenerator *this,ostream *os)

{
  cmScriptGeneratorIndent cVar1;
  char *component;
  ostream *poVar2;
  undefined1 local_40 [8];
  string component_test;
  Indent indent;
  ostream *os_local;
  cmInstallGenerator *this_local;
  
  cmScriptGeneratorIndent::cmScriptGeneratorIndent
            ((cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc));
  component = (char *)std::__cxx11::string::c_str();
  CreateComponentTest_abi_cxx11_((string *)local_40,this,component,(bool)(this->ExcludeFromAll & 1))
  ;
  poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)component_test.field_2._12_4_);
  poVar2 = std::operator<<(poVar2,"if(");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  std::operator<<(poVar2,")\n");
  cVar1 = cmScriptGeneratorIndent::Next
                    ((cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc),2);
  (*(this->super_cmScriptGenerator)._vptr_cmScriptGenerator[3])(this,os,(ulong)(uint)cVar1.Level);
  poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)component_test.field_2._12_4_);
  std::operator<<(poVar2,"endif()\n\n");
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmInstallGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  // Begin this block of installation.
  std::string component_test =
    this->CreateComponentTest(this->Component.c_str(), this->ExcludeFromAll);
  os << indent << "if(" << component_test << ")\n";

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os, indent.Next());

  // End this block of installation.
  os << indent << "endif()\n\n";
}